

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O0

Aig_Man_t * Saig_ManReadBlif(char *pFileName)

{
  int iVar1;
  int iVar2;
  FILE *pFile_00;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  Aig_Obj_t *p_00;
  void *pvVar6;
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  int *piStack_68;
  int Size;
  int *pNum2Id;
  int local_58;
  int Number;
  int nRegs;
  int nPos;
  int nPis;
  int i;
  char *pToken;
  Aig_Obj_t *pNode;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Man_t *p;
  FILE *pFile;
  char *pFileName_local;
  
  piStack_68 = (int *)0x0;
  pFile_00 = fopen(pFileName,"r");
  if (pFile_00 == (FILE *)0x0) {
    printf("Saig_ManReadBlif(): Cannot open file for reading.\n");
    pFileName_local = (char *)0x0;
  }
  else {
    do {
      pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
      bVar7 = false;
      if (pcVar3 != (char *)0x0) {
        bVar7 = *pcVar3 != '.';
      }
    } while (bVar7);
    if (pcVar3 == (char *)0x0) {
      printf("Saig_ManReadBlif(): Error 1.\n");
      pFileName_local = (char *)0x0;
    }
    else {
      pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
      if (pcVar3 == (char *)0x0) {
        printf("Saig_ManReadBlif(): Error 2.\n");
        pFileName_local = (char *)0x0;
      }
      else {
        pFileName_local = (char *)Aig_ManStart(10000);
        pcVar3 = Abc_UtilStrsav(pcVar3);
        ((Aig_Man_t *)pFileName_local)->pName = pcVar3;
        pcVar3 = Abc_UtilStrsav(pFileName);
        ((Aig_Man_t *)pFileName_local)->pSpec = pcVar3;
        pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
        if ((pcVar3 == (char *)0x0) || (iVar1 = strcmp(pcVar3,".inputs"), iVar1 != 0)) {
          printf("Saig_ManReadBlif(): Error 3.\n");
          Aig_ManStop((Aig_Man_t *)pFileName_local);
          pFileName_local = (char *)0x0;
        }
        else {
          nRegs = 0;
          while( true ) {
            pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
            bVar7 = false;
            if (pcVar3 != (char *)0x0) {
              bVar7 = *pcVar3 != '.';
            }
            if (!bVar7) break;
            nRegs = nRegs + 1;
          }
          if ((pcVar3 == (char *)0x0) || (iVar1 = strcmp(pcVar3,".outputs"), iVar1 != 0)) {
            printf("Saig_ManReadBlif(): Error 4.\n");
            Aig_ManStop((Aig_Man_t *)pFileName_local);
            pFileName_local = (char *)0x0;
          }
          else {
            Number = 0;
            while( true ) {
              _nPis = Saig_ManReadToken((FILE *)pFile_00);
              bVar7 = false;
              if (_nPis != (char *)0x0) {
                bVar7 = *_nPis != '.';
              }
              if (!bVar7) break;
              Number = Number + 1;
            }
            if (_nPis == (char *)0x0) {
              printf("Saig_ManReadBlif(): Error 5.\n");
              Aig_ManStop((Aig_Man_t *)pFileName_local);
              pFileName_local = (char *)0x0;
            }
            else {
              local_58 = 0;
              while (iVar1 = strcmp(_nPis,".latch"), iVar1 == 0) {
                pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                if (pcVar3 == (char *)0x0) {
                  printf("Saig_ManReadBlif(): Error 6.\n");
                  Aig_ManStop((Aig_Man_t *)pFileName_local);
                  return (Aig_Man_t *)0x0;
                }
                pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                if (pcVar3 == (char *)0x0) {
                  printf("Saig_ManReadBlif(): Error 7.\n");
                  Aig_ManStop((Aig_Man_t *)pFileName_local);
                  return (Aig_Man_t *)0x0;
                }
                pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                if (pcVar3 == (char *)0x0) {
                  printf("Saig_ManReadBlif(): Error 8.\n");
                  Aig_ManStop((Aig_Man_t *)pFileName_local);
                  return (Aig_Man_t *)0x0;
                }
                _nPis = Saig_ManReadToken((FILE *)pFile_00);
                if (_nPis == (char *)0x0) {
                  printf("Saig_ManReadBlif(): Error 9.\n");
                  Aig_ManStop((Aig_Man_t *)pFileName_local);
                  return (Aig_Man_t *)0x0;
                }
                local_58 = local_58 + 1;
              }
              for (nPos = 0; nPos < nRegs + local_58; nPos = nPos + 1) {
                Aig_ObjCreateCi((Aig_Man_t *)pFileName_local);
              }
              Aig_ManSetRegNum((Aig_Man_t *)pFileName_local,local_58);
              nPos = 0;
              while (iVar1 = strcmp(_nPis,".names"), iVar1 == 0) {
                pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                if ((nPos == 0) && (*pcVar3 == 'n')) {
                  pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                  if ((pcVar3 == (char *)0x0) || (iVar1 = strcmp(pcVar3,"1"), iVar1 != 0)) {
                    printf("Saig_ManReadBlif(): Error 10.\n");
                    Aig_ManStop((Aig_Man_t *)pFileName_local);
                    return (Aig_Man_t *)0x0;
                  }
                  _nPis = Saig_ManReadToken((FILE *)pFile_00);
                  if (_nPis == (char *)0x0) {
                    printf("Saig_ManReadBlif(): Error 11.\n");
                    Aig_ManStop((Aig_Man_t *)pFileName_local);
                    return (Aig_Man_t *)0x0;
                  }
                }
                else {
                  pFanin1 = Saig_ManReadNode((Aig_Man_t *)pFileName_local,piStack_68,pcVar3);
                  pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                  if (((*pcVar3 == 'p') && (pcVar3[1] == 'o')) ||
                     ((*pcVar3 == 'l' && (pcVar3[1] == 'i')))) {
                    pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                    if (pcVar3 == (char *)0x0) {
                      printf("Saig_ManReadBlif(): Error 12.\n");
                      Aig_ManStop((Aig_Man_t *)pFileName_local);
                      return (Aig_Man_t *)0x0;
                    }
                    if (*pcVar3 == '0') {
                      pFanin1 = Aig_Not(pFanin1);
                    }
                    pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                    if ((pcVar3 == (char *)0x0) || (iVar1 = strcmp(pcVar3,"1"), iVar1 != 0)) {
                      printf("Saig_ManReadBlif(): Error 13.\n");
                      Aig_ManStop((Aig_Man_t *)pFileName_local);
                      return (Aig_Man_t *)0x0;
                    }
                    Aig_ObjCreateCo((Aig_Man_t *)pFileName_local,pFanin1);
                    _nPis = Saig_ManReadToken((FILE *)pFile_00);
                    if (_nPis == (char *)0x0) {
                      printf("Saig_ManReadBlif(): Error 14.\n");
                      Aig_ManStop((Aig_Man_t *)pFileName_local);
                      return (Aig_Man_t *)0x0;
                    }
                  }
                  else {
                    pNode = Saig_ManReadNode((Aig_Man_t *)pFileName_local,piStack_68,pcVar3);
                    pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                    iVar1 = Saig_ManReadNumber((Aig_Man_t *)pFileName_local,pcVar3);
                    if (piStack_68 == (int *)0x0) {
                      sVar4 = strlen(pcVar3);
                      lVar5 = sVar4 - 1;
                      auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
                      auVar9._0_8_ = lVar5;
                      auVar9._12_4_ = 0x45300000;
                      dVar8 = pow(10.0,(auVar9._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0
                                       ));
                      piStack_68 = (int *)calloc((long)(int)dVar8,4);
                    }
                    pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                    if (pcVar3 == (char *)0x0) {
                      printf("Saig_ManReadBlif(): Error 15.\n");
                      Aig_ManStop((Aig_Man_t *)pFileName_local);
                      return (Aig_Man_t *)0x0;
                    }
                    if (*pcVar3 == '0') {
                      pFanin1 = Aig_Not(pFanin1);
                    }
                    if (pcVar3[1] == '0') {
                      pNode = Aig_Not(pNode);
                    }
                    pcVar3 = Saig_ManReadToken((FILE *)pFile_00);
                    if ((pcVar3 == (char *)0x0) || (iVar2 = strcmp(pcVar3,"1"), iVar2 != 0)) {
                      printf("Saig_ManReadBlif(): Error 16.\n");
                      Aig_ManStop((Aig_Man_t *)pFileName_local);
                      return (Aig_Man_t *)0x0;
                    }
                    _nPis = Saig_ManReadToken((FILE *)pFile_00);
                    if (_nPis == (char *)0x0) {
                      printf("Saig_ManReadBlif(): Error 17.\n");
                      Aig_ManStop((Aig_Man_t *)pFileName_local);
                      return (Aig_Man_t *)0x0;
                    }
                    p_00 = Aig_And((Aig_Man_t *)pFileName_local,pFanin1,pNode);
                    iVar2 = Aig_IsComplement(p_00);
                    if (iVar2 != 0) {
                      printf("Saig_ManReadBlif(): Error 18.\n");
                      Aig_ManStop((Aig_Man_t *)pFileName_local);
                      return (Aig_Man_t *)0x0;
                    }
                    piStack_68[iVar1] = p_00->Id;
                  }
                }
                nPos = nPos + 1;
              }
              if ((_nPis == (char *)0x0) || (iVar1 = strcmp(_nPis,".end"), iVar1 != 0)) {
                printf("Saig_ManReadBlif(): Error 19.\n");
                Aig_ManStop((Aig_Man_t *)pFileName_local);
                pFileName_local = (char *)0x0;
              }
              else {
                iVar1 = Aig_ManCoNum((Aig_Man_t *)pFileName_local);
                if (Number + local_58 == iVar1) {
                  for (nPos = 0; iVar1 = Vec_PtrSize(((Aig_Man_t *)pFileName_local)->vCis),
                      nPos < iVar1; nPos = nPos + 1) {
                    pvVar6 = Vec_PtrEntry(((Aig_Man_t *)pFileName_local)->vCis,nPos);
                    piStack_68[*(int *)((long)pvVar6 + 0x24)] = *(int *)((long)pvVar6 + 0x24);
                  }
                  ((Aig_Man_t *)pFileName_local)->pData = piStack_68;
                  Aig_ManSetRegNum((Aig_Man_t *)pFileName_local,local_58);
                  iVar1 = Aig_ManCheck((Aig_Man_t *)pFileName_local);
                  if (iVar1 == 0) {
                    printf("Saig_ManReadBlif(): Check has failed.\n");
                  }
                }
                else {
                  printf("Saig_ManReadBlif(): Error 20.\n");
                  Aig_ManStop((Aig_Man_t *)pFileName_local);
                  pFileName_local = (char *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  return (Aig_Man_t *)pFileName_local;
}

Assistant:

Aig_Man_t * Saig_ManReadBlif( char * pFileName )
{
    FILE * pFile;
    Aig_Man_t * p;
    Aig_Obj_t * pFanin0, * pFanin1, * pNode;
    char * pToken;
    int i, nPis, nPos, nRegs, Number;
    int * pNum2Id = NULL;  // mapping of node numbers in the file into AIG node IDs
    // open the file
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Saig_ManReadBlif(): Cannot open file for reading.\n" );
        return NULL;
    }
    // skip through the comments
    for ( i = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; i++ );
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 1.\n" ); return NULL; }
    // get he model
    pToken = Saig_ManReadToken( pFile );
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 2.\n" ); return NULL; }
    // start the package
    p = Aig_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( pToken );
    p->pSpec = Abc_UtilStrsav( pFileName );
    // count PIs
    pToken = Saig_ManReadToken( pFile );
    if ( pToken == NULL || strcmp( pToken, ".inputs" ) ) 
        { printf( "Saig_ManReadBlif(): Error 3.\n" ); Aig_ManStop(p); return NULL; }
    for ( nPis = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; nPis++ );
    // count POs
    if ( pToken == NULL || strcmp( pToken, ".outputs" ) ) 
        { printf( "Saig_ManReadBlif(): Error 4.\n" ); Aig_ManStop(p); return NULL; }
    for ( nPos = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; nPos++ );
    // count latches
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 5.\n" ); Aig_ManStop(p); return NULL; }
    for ( nRegs = 0; strcmp( pToken, ".latch" ) == 0; nRegs++ )
    {
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 6.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 7.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 8.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 9.\n" ); Aig_ManStop(p); return NULL; }
    }
    // create PIs and LOs
    for ( i = 0; i < nPis + nRegs; i++ )
        Aig_ObjCreateCi( p );
    Aig_ManSetRegNum( p, nRegs );
    // create nodes
    for ( i = 0; strcmp( pToken, ".names" ) == 0; i++ )
    {
        // first token
        pToken = Saig_ManReadToken( pFile );
        if ( i == 0 && pToken[0] == 'n' )
        { // constant node
            // read 1
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL || strcmp( pToken, "1" ) ) 
                { printf( "Saig_ManReadBlif(): Error 10.\n" ); Aig_ManStop(p); return NULL; }
            // read next
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 11.\n" ); Aig_ManStop(p); return NULL; }
            continue;
        }
        pFanin0 = Saig_ManReadNode( p, pNum2Id, pToken );

        // second token
        pToken = Saig_ManReadToken( pFile );
        if ( (pToken[0] == 'p' && pToken[1] == 'o') || (pToken[0] == 'l' && pToken[1] == 'i') )
        { // buffer
            // read complemented attribute
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 12.\n" ); Aig_ManStop(p); return NULL; }
            if ( pToken[0] == '0' )
                pFanin0 = Aig_Not(pFanin0);
            // read 1
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL || strcmp( pToken, "1" ) ) 
                { printf( "Saig_ManReadBlif(): Error 13.\n" ); Aig_ManStop(p); return NULL; }
            Aig_ObjCreateCo( p, pFanin0 );
            // read next
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 14.\n" ); Aig_ManStop(p); return NULL; }
            continue;
        }

        // third token
        // regular node
        pFanin1 = Saig_ManReadNode( p, pNum2Id, pToken );
        pToken = Saig_ManReadToken( pFile );
        Number = Saig_ManReadNumber( p, pToken );
        // allocate mapping
        if ( pNum2Id == NULL )
        {
//            extern double pow( double x, double y );
            int Size = (int)pow(10.0, (double)(strlen(pToken) - 1));
            pNum2Id = ABC_CALLOC( int, Size );
        }

        // other tokens
        // get the complemented attributes
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 15.\n" ); Aig_ManStop(p); return NULL; }
        if ( pToken[0] == '0' )
            pFanin0 = Aig_Not(pFanin0);
        if ( pToken[1] == '0' )
            pFanin1 = Aig_Not(pFanin1);
        // read 1
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL || strcmp( pToken, "1" ) ) 
            { printf( "Saig_ManReadBlif(): Error 16.\n" ); Aig_ManStop(p); return NULL; }
        // read next
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 17.\n" ); Aig_ManStop(p); return NULL; }

        // create new node
        pNode = Aig_And( p, pFanin0, pFanin1 );
        if ( Aig_IsComplement(pNode) )
            { printf( "Saig_ManReadBlif(): Error 18.\n" ); Aig_ManStop(p); return NULL; }
        // set mapping
        pNum2Id[ Number ] = pNode->Id;
    }
    if ( pToken == NULL || strcmp( pToken, ".end" ) ) 
        { printf( "Saig_ManReadBlif(): Error 19.\n" ); Aig_ManStop(p); return NULL; }
    if ( nPos + nRegs != Aig_ManCoNum(p) ) 
        { printf( "Saig_ManReadBlif(): Error 20.\n" ); Aig_ManStop(p); return NULL; }
    // add non-node objects to the mapping
    Aig_ManForEachCi( p, pNode, i )
        pNum2Id[pNode->Id] = pNode->Id;
//    ABC_FREE( pNum2Id );
    p->pData = pNum2Id;
    // check the new manager
    Aig_ManSetRegNum( p, nRegs );
    if ( !Aig_ManCheck(p) )
        printf( "Saig_ManReadBlif(): Check has failed.\n" );
    return p;
}